

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

int __thiscall diy::FileStorage::put(FileStorage *this,void *x,Save *save)

{
  int iVar1;
  void *in_RDX;
  function<void_(const_void_*,_diy::BinaryBuffer_&)> *in_RDI;
  size_t sz;
  FileBuffer fb;
  int fh;
  string filename;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  FileBuffer *in_stack_ffffffffffffff60;
  string *filename_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  FileBuffer local_70;
  uint local_3c;
  string local_38;
  
  filename_00 = &local_38;
  std::__cxx11::string::string((string *)filename_00);
  local_3c = open_random((FileStorage *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),filename_00);
  fdopen(local_3c,"w");
  detail::FileBuffer::FileBuffer
            (in_stack_ffffffffffffff60,
             (FILE *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  Catch::clara::std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::operator()
            (in_RDI,in_RDX,&in_stack_ffffffffffffff60->super_BinaryBuffer);
  detail::FileBuffer::size(&local_70);
  fclose((FILE *)local_70.file);
  io::utils::sync((utils *)(ulong)local_3c);
  iVar1 = make_file_record((FileStorage *)filename.field_2._M_allocated_capacity,
                           (string *)filename._M_string_length,filename._0_8_);
  detail::FileBuffer::~FileBuffer((FileBuffer *)0x19777b);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

virtual int    put(const void* x, detail::Save save) override
      {
        std::string     filename;
        int fh = open_random(filename);
#if defined(_WIN32)
        detail::FileBuffer fb(_fdopen(fh, "wb"));
#else
        detail::FileBuffer fb(fdopen(fh, "w"));
#endif
        save(x, fb);
        size_t sz = fb.size();
        fclose(fb.file);
        io::utils::sync(fh);

        return make_file_record(filename, sz);
      }